

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

string * __thiscall
t_cpp_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_field *tfield,bool init,
          bool pointer,bool constant,bool reference)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  t_type *ttype;
  undefined8 *puVar4;
  size_type *psVar5;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  t_base_type *this_00;
  undefined1 auVar6 [12];
  string local_a0;
  undefined4 local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (CONCAT31(in_register_00000089,constant) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  type_name_abi_cxx11_(&local_a0,this,tfield->type_,false,false);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (tfield->reference_ == true) {
    std::operator+(&local_78,"::std::shared_ptr<",__return_storage_ptr__);
    local_7c = (undefined4)CONCAT71(in_register_00000081,pointer);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0.field_2._8_8_ = plVar3[3];
      local_a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar5;
      local_a0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_a0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    pointer = SUB41(local_7c,0);
  }
  if (pointer != false) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (reference) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::operator+(&local_a0," ",&tfield->name_);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (init) {
    ttype = t_type::get_true_type(tfield->type_);
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
      if ((char)iVar2 != '\0') {
        type_name_abi_cxx11_(&local_50,this,ttype,false,false);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x382c90);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_78.field_2._M_allocated_capacity = *psVar5;
          local_78.field_2._8_8_ = plVar3[3];
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        }
        else {
          local_78.field_2._M_allocated_capacity = *psVar5;
          local_78._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_78._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
        psVar5 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_a0.field_2._M_allocated_capacity = *psVar5;
          local_a0.field_2._8_8_ = puVar4[3];
          local_a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar5;
          local_a0._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_a0._M_string_length = puVar4[1];
        *puVar4 = psVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
    else {
      this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
      switch(this_00) {
      case (t_base_type *)0x0:
      case (t_base_type *)0x1:
        goto switchD_00187783_caseD_0;
      case (t_base_type *)0x2:
        break;
      case (t_base_type *)0x3:
      case (t_base_type *)0x4:
      case (t_base_type *)0x5:
      case (t_base_type *)0x6:
        break;
      case (t_base_type *)0x7:
        break;
      default:
        auVar6 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_a0,this_00,auVar6._8_4_);
        std::operator+(auVar6._0_8_,"compiler error: no C++ initializer for base type ",&local_a0);
        __cxa_throw(auVar6._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
switchD_00187783_caseD_0:
  if (!reference) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::declare_field(t_field* tfield,
                                      bool init,
                                      bool pointer,
                                      bool constant,
                                      bool reference) {
  // TODO(mcslee): do we ever need to initialize the field?
  string result = "";
  if (constant) {
    result += "const ";
  }
  result += type_name(tfield->get_type());
  if (is_reference(tfield)) {
    result = "::std::shared_ptr<" + result + ">";
  }
  if (pointer) {
    result += "*";
  }
  if (reference) {
    result += "&";
  }
  result += " " + tfield->get_name();
  if (init) {
    t_type* type = get_true_type(tfield->get_type());

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
      case t_base_type::TYPE_STRING:
        break;
      case t_base_type::TYPE_BOOL:
        result += " = false";
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
        result += " = 0";
        break;
      case t_base_type::TYPE_DOUBLE:
        result += " = 0.0";
        break;
      default:
        throw "compiler error: no C++ initializer for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      result += " = static_cast<" + type_name(type) + ">(0)";
    }
  }
  if (!reference) {
    result += ";";
  }
  return result;
}